

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int handle_certificate(ptls_t *tls,uint8_t *src,uint8_t *end,int *got_certs)

{
  st_ptls_on_extension_t *psVar1;
  st_ptls_verify_certificate_t *psVar2;
  uint *puVar3;
  ushort id;
  ushort uVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  ushort *puVar8;
  int iVar9;
  ulong uVar10;
  ushort *puVar11;
  uint8_t *puVar12;
  ushort *puVar13;
  ptls_iovec_t pVar14;
  st_ptls_extension_bitmap_t local_158;
  ushort *local_150;
  uint *local_148;
  ulong local_140;
  ptls_iovec_t certs [16];
  
  iVar9 = 0x32;
  iVar5 = iVar9;
  if (src != end) {
    if ((((uint8_t *)(ulong)*src <= end + ~(ulong)src) && (iVar5 = 0x2f, *src == 0)) &&
       (iVar5 = iVar9, (uint8_t *)0x2 < end + ~(ulong)src)) {
      lVar6 = 1;
      uVar7 = 0;
      do {
        uVar7 = (ulong)src[lVar6] | uVar7 << 8;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      puVar11 = (ushort *)(src + 4);
      if (uVar7 <= (ulong)((long)end - (long)puVar11)) {
        puVar8 = (ushort *)(uVar7 + (long)puVar11);
        uVar7 = 0;
        local_150 = (ushort *)end;
        local_148 = (uint *)got_certs;
        while (puVar3 = local_148, puVar11 != puVar8) {
          if ((ulong)((long)puVar8 - (long)puVar11) < 3) {
            return 0x32;
          }
          lVar6 = 0;
          uVar10 = 0;
          do {
            uVar10 = (ulong)*(byte *)((long)puVar11 + lVar6) | uVar10 << 8;
            lVar6 = lVar6 + 1;
          } while (lVar6 != 3);
          puVar12 = (uint8_t *)((long)puVar11 + 3);
          if ((ulong)((long)puVar8 - (long)puVar12) < uVar10) {
            return 0x32;
          }
          local_140 = uVar7;
          if (uVar7 < 0x10) {
            local_140 = uVar7 + 1;
            certs[uVar7].base = puVar12;
            certs[uVar7].len = uVar10;
          }
          puVar11 = (ushort *)(puVar12 + uVar10);
          builtin_memcpy(local_158.bits,"\x01$\x11",4);
          local_158.bits[4] = '\0';
          local_158.bits[5] = '>';
          local_158.bits[6] = '\b';
          local_158.bits[7] = '\0';
          if ((ulong)((long)puVar8 - (long)puVar11) < 2) {
            return 0x32;
          }
          puVar13 = puVar11 + 1;
          uVar7 = (ulong)(ushort)(*puVar11 << 8 | *puVar11 >> 8);
          if ((ulong)((long)puVar8 - (long)puVar13) < uVar7) {
            return 0x32;
          }
          puVar11 = (ushort *)(uVar7 + (long)puVar13);
          while (uVar7 = local_140, puVar13 != puVar11) {
            if ((long)puVar11 - (long)puVar13 < 2) {
              return 0x32;
            }
            id = *puVar13 << 8 | *puVar13 >> 8;
            if ((id < 0x40) && ((local_158.bits[id >> 3] >> (id & 7) & 1) != 0)) {
              return 0x2f;
            }
            extension_bitmap_set(&local_158,id);
            if ((ulong)((long)puVar11 - (long)(puVar13 + 1)) < 2) {
              return 0x32;
            }
            uVar4 = puVar13[1] << 8 | puVar13[1] >> 8;
            pVar14.base = puVar13 + 2;
            if ((ulong)((long)puVar11 - (long)pVar14.base) < (ulong)uVar4) {
              return 0x32;
            }
            puVar13 = (ushort *)((long)pVar14.base + (ulong)uVar4);
            psVar1 = tls->ctx->on_extension;
            if ((psVar1 != (st_ptls_on_extension_t *)0x0) &&
               (pVar14.len._0_2_ = uVar4, pVar14.len._2_6_ = 0,
               iVar5 = (*psVar1->cb)(psVar1,tls,'\v',id,pVar14), iVar5 != 0)) {
              return 1;
            }
          }
        }
        iVar5 = 0x32;
        if ((puVar8 == local_150) &&
           (((uVar7 == 0 ||
             (psVar2 = tls->ctx->verify_certificate, psVar2 == (st_ptls_verify_certificate_t *)0x0))
            || (iVar5 = (*psVar2->cb)(psVar2,tls,&(tls->certificate_verify).cb,
                                      &(tls->certificate_verify).verify_ctx,certs,uVar7), iVar5 == 0
               )))) {
          *puVar3 = (uint)(uVar7 != 0);
          iVar5 = 0;
        }
      }
    }
  }
  return iVar5;
}

Assistant:

static int handle_certificate(ptls_t *tls, const uint8_t *src, const uint8_t *end, int *got_certs)
{
    ptls_iovec_t certs[16];
    size_t num_certs = 0;
    int ret = 0;

    /* certificate request context */
    ptls_decode_open_block(src, end, 1, {
        if (src != end) {
            ret = PTLS_ALERT_ILLEGAL_PARAMETER;
            goto Exit;
        }
    });
    /* certificate_list */
    ptls_decode_block(src, end, 3, {
        while (src != end) {
            ptls_decode_open_block(src, end, 3, {
                if (num_certs < PTLS_ELEMENTSOF(certs))
                    certs[num_certs++] = ptls_iovec_init(src, end - src);
                src = end;
            });
            uint16_t type;
            decode_open_extensions(src, end, PTLS_HANDSHAKE_TYPE_CERTIFICATE, &type, {
                if (tls->ctx->on_extension != NULL &&
                    (ret = tls->ctx->on_extension->cb(tls->ctx->on_extension, tls, PTLS_HANDSHAKE_TYPE_CERTIFICATE, type,
                                                      ptls_iovec_init(src, end - src)) != 0))
                    goto Exit;
                src = end;
            });
        }
    });

    if (num_certs != 0 && tls->ctx->verify_certificate != NULL) {
        if ((ret = tls->ctx->verify_certificate->cb(tls->ctx->verify_certificate, tls, &tls->certificate_verify.cb,
                                                    &tls->certificate_verify.verify_ctx, certs, num_certs)) != 0)
            goto Exit;
    }

    *got_certs = num_certs != 0;

Exit:
    return ret;
}